

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_char>>
               (GetterYs<unsigned_char> getter,TransformerLogLog transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  bool bVar1;
  ImPlotPoint local_58;
  ImVec2 local_44;
  ImVec2 c;
  int i;
  ImPlotContext *gp;
  bool rend_mk_fill_local;
  float weight_local;
  ImU32 col_mk_line_local;
  bool rend_mk_line_local;
  float size_local;
  ImPlotMarker marker_local;
  ImDrawList *DrawList_local;
  TransformerLogLog transformer_local;
  
  stack0xffffffffffffffc8 = GImPlot;
  DrawList_local._4_4_ = transformer.YAxis;
  for (c.x = 0.0; (int)c.x < getter.Count; c.x = (float)((int)c.x + 1)) {
    local_58 = GetterYs<unsigned_char>::operator()(&getter,(int)c.x);
    local_44 = TransformerLogLog::operator()
                         ((TransformerLogLog *)((long)&DrawList_local + 4),&local_58);
    bVar1 = ImRect::Contains(&stack0xffffffffffffffc8->CurrentPlot->PlotRect,&local_44);
    if (bVar1) {
      (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterYs<unsigned_char>_>::marker_table
        [marker])(DrawList,&local_44,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight);
    }
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}